

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int mbedtls_ecp_group_load(mbedtls_ecp_group *grp,mbedtls_ecp_group_id id)

{
  mbedtls_mpi *pmVar1;
  int iVar2;
  mbedtls_mpi_uint *pmVar3;
  size_t sVar4;
  mbedtls_mpi_uint *pmVar5;
  mbedtls_mpi_uint *pmVar6;
  mbedtls_mpi_uint *pmVar7;
  mbedtls_mpi_uint *pmVar8;
  mbedtls_mpi_uint *gx;
  size_t alen;
  mbedtls_mpi local_30;
  
  mbedtls_ecp_group_free(grp);
  grp->id = id;
  switch(id) {
  case MBEDTLS_ECP_DP_SECP192R1:
    grp->modp = ecp_mod_p192;
    sVar4 = 0x18;
    pmVar3 = secp192r1_n;
    pmVar7 = secp192r1_gy;
    pmVar8 = secp192r1_gx;
    pmVar5 = secp192r1_p;
    pmVar6 = secp192r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP224R1:
    grp->modp = ecp_mod_p224;
    sVar4 = 0x20;
    pmVar3 = secp224r1_n;
    pmVar7 = secp224r1_gy;
    pmVar8 = secp224r1_gx;
    pmVar5 = secp224r1_p;
    pmVar6 = secp224r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP256R1:
    grp->modp = ecp_mod_p256;
    sVar4 = 0x20;
    pmVar3 = secp256r1_n;
    pmVar7 = secp256r1_gy;
    pmVar8 = secp256r1_gx;
    pmVar5 = secp256r1_p;
    pmVar6 = secp256r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP384R1:
    grp->modp = ecp_mod_p384;
    sVar4 = 0x30;
    pmVar3 = secp384r1_n;
    pmVar7 = secp384r1_gy;
    pmVar8 = secp384r1_gx;
    pmVar5 = secp384r1_p;
    pmVar6 = secp384r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP521R1:
    grp->modp = ecp_mod_p521;
    sVar4 = 0x48;
    pmVar3 = secp521r1_n;
    pmVar7 = secp521r1_gy;
    pmVar8 = secp521r1_gx;
    pmVar5 = secp521r1_p;
    pmVar6 = secp521r1_b;
    break;
  case MBEDTLS_ECP_DP_BP256R1:
    sVar4 = 0x20;
    pmVar3 = brainpoolP256r1_n;
    pmVar8 = brainpoolP256r1_gy;
    gx = brainpoolP256r1_gx;
    pmVar6 = brainpoolP256r1_p;
    pmVar5 = brainpoolP256r1_a;
    pmVar7 = brainpoolP256r1_b;
    alen = sVar4;
    goto LAB_001226ca;
  case MBEDTLS_ECP_DP_BP384R1:
    sVar4 = 0x30;
    pmVar3 = brainpoolP384r1_n;
    pmVar8 = brainpoolP384r1_gy;
    gx = brainpoolP384r1_gx;
    pmVar6 = brainpoolP384r1_p;
    pmVar5 = brainpoolP384r1_a;
    pmVar7 = brainpoolP384r1_b;
    alen = sVar4;
    goto LAB_001226ca;
  case MBEDTLS_ECP_DP_BP512R1:
    sVar4 = 0x40;
    pmVar3 = brainpoolP512r1_n;
    pmVar8 = brainpoolP512r1_gy;
    gx = brainpoolP512r1_gx;
    pmVar6 = brainpoolP512r1_p;
    pmVar5 = brainpoolP512r1_a;
    pmVar7 = brainpoolP512r1_b;
    alen = sVar4;
    goto LAB_001226ca;
  case MBEDTLS_ECP_DP_CURVE25519:
    grp->modp = ecp_mod_p255;
    iVar2 = mbedtls_mpi_read_string(&grp->A,0x10,"01DB42");
    if (iVar2 == 0) {
      pmVar1 = &grp->P;
      iVar2 = mbedtls_mpi_lset(pmVar1,1);
      if (((iVar2 == 0) && (iVar2 = mbedtls_mpi_shift_l(pmVar1,0xff), iVar2 == 0)) &&
         (iVar2 = mbedtls_mpi_sub_int(pmVar1,pmVar1,0x13), iVar2 == 0)) {
        sVar4 = mbedtls_mpi_bitlen(pmVar1);
        grp->pbits = sVar4;
        iVar2 = mbedtls_mpi_read_string(&grp->N,0x10,"14DEF9DEA2F79CD65812631A5CF5D3ED");
        if (((iVar2 == 0) && (iVar2 = mbedtls_mpi_set_bit(&grp->N,0xfc,'\x01'), iVar2 == 0)) &&
           ((iVar2 = mbedtls_mpi_lset(&(grp->G).X,9), iVar2 == 0 &&
            (iVar2 = mbedtls_mpi_lset(&(grp->G).Z,1), iVar2 == 0)))) {
          mbedtls_mpi_free(&(grp->G).Y);
          grp->nbits = 0xfe;
          return 0;
        }
      }
    }
    goto LAB_001227a4;
  case MBEDTLS_ECP_DP_CURVE448:
    grp->modp = ecp_mod_p448;
    mbedtls_mpi_init(&local_30);
    iVar2 = mbedtls_mpi_read_string(&grp->A,0x10,"98AA");
    if (iVar2 == 0) {
      pmVar1 = &grp->P;
      iVar2 = mbedtls_mpi_lset(pmVar1,1);
      if ((((iVar2 == 0) && (iVar2 = mbedtls_mpi_shift_l(pmVar1,0xe0), iVar2 == 0)) &&
          (iVar2 = mbedtls_mpi_sub_int(pmVar1,pmVar1,1), iVar2 == 0)) &&
         ((iVar2 = mbedtls_mpi_shift_l(pmVar1,0xe0), iVar2 == 0 &&
          (iVar2 = mbedtls_mpi_sub_int(pmVar1,pmVar1,1), iVar2 == 0)))) {
        sVar4 = mbedtls_mpi_bitlen(pmVar1);
        grp->pbits = sVar4;
        iVar2 = mbedtls_mpi_lset(&(grp->G).X,5);
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_lset(&(grp->G).Z,1), iVar2 == 0)) {
          mbedtls_mpi_free(&(grp->G).Y);
          pmVar1 = &grp->N;
          iVar2 = mbedtls_mpi_set_bit(pmVar1,0x1be,'\x01');
          if (((iVar2 == 0) &&
              (iVar2 = mbedtls_mpi_read_string
                                 (&local_30,0x10,
                                  "8335DC163BB124B65129C96FDE933D8D723A70AADC873D6D54A7BB0D"),
              iVar2 == 0)) && (iVar2 = mbedtls_mpi_sub_mpi(pmVar1,pmVar1,&local_30), iVar2 == 0)) {
            grp->nbits = 0x1bf;
            iVar2 = 0;
          }
        }
      }
    }
    mbedtls_mpi_free(&local_30);
    if (iVar2 == 0) {
      return 0;
    }
LAB_001227a4:
    mbedtls_ecp_group_free(grp);
    return iVar2;
  case MBEDTLS_ECP_DP_SECP192K1:
    grp->modp = ecp_mod_p192k1;
    sVar4 = 0x18;
    pmVar3 = secp192k1_n;
    pmVar8 = secp192k1_gy;
    gx = secp192k1_gx;
    pmVar6 = secp192k1_p;
    pmVar5 = secp192k1_a;
    pmVar7 = secp192k1_b;
    goto LAB_001226b9;
  case MBEDTLS_ECP_DP_SECP224K1:
    grp->modp = ecp_mod_p224k1;
    sVar4 = 0x20;
    pmVar3 = secp224k1_n;
    pmVar8 = secp224k1_gy;
    gx = secp224k1_gx;
    pmVar6 = secp224k1_p;
    pmVar5 = secp224k1_a;
    pmVar7 = secp224k1_b;
    goto LAB_001226b9;
  case MBEDTLS_ECP_DP_SECP256K1:
    grp->modp = ecp_mod_p256k1;
    sVar4 = 0x20;
    pmVar3 = secp256k1_n;
    pmVar8 = secp256k1_gy;
    gx = secp256k1_gx;
    pmVar6 = secp256k1_p;
    pmVar5 = secp256k1_a;
    pmVar7 = secp256k1_b;
LAB_001226b9:
    alen = 8;
LAB_001226ca:
    ecp_group_load(grp,pmVar6,sVar4,pmVar5,alen,pmVar7,alen,gx,sVar4,pmVar8,sVar4,pmVar3,sVar4);
    return 0;
  default:
    mbedtls_ecp_group_free(grp);
    return -0x4e80;
  }
  ecp_group_load(grp,pmVar5,sVar4,(mbedtls_mpi_uint *)0x0,0,pmVar6,sVar4,pmVar8,sVar4,pmVar7,sVar4,
                 pmVar3,sVar4);
  return 0;
}

Assistant:

int mbedtls_ecp_group_load( mbedtls_ecp_group *grp, mbedtls_ecp_group_id id )
{
    mbedtls_ecp_group_free( grp );

    grp->id = id;

    switch( id )
    {
#if defined(MBEDTLS_ECP_DP_SECP192R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192R1:
            NIST_MODP( p192 );
            return( LOAD_GROUP( secp192r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224R1:
            NIST_MODP( p224 );
            return( LOAD_GROUP( secp224r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256R1:
            NIST_MODP( p256 );
            return( LOAD_GROUP( secp256r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP384R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP384R1:
            NIST_MODP( p384 );
            return( LOAD_GROUP( secp384r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP521R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP521R1:
            NIST_MODP( p521 );
            return( LOAD_GROUP( secp521r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP521R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP192K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192K1:
            grp->modp = ecp_mod_p192k1;
            return( LOAD_GROUP_A( secp192k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224K1:
            grp->modp = ecp_mod_p224k1;
            return( LOAD_GROUP_A( secp224k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256K1:
            grp->modp = ecp_mod_p256k1;
            return( LOAD_GROUP_A( secp256k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP256R1_ENABLED)
        case MBEDTLS_ECP_DP_BP256R1:
            return( LOAD_GROUP_A( brainpoolP256r1 ) );
#endif /* MBEDTLS_ECP_DP_BP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP384R1_ENABLED)
        case MBEDTLS_ECP_DP_BP384R1:
            return( LOAD_GROUP_A( brainpoolP384r1 ) );
#endif /* MBEDTLS_ECP_DP_BP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP512R1_ENABLED)
        case MBEDTLS_ECP_DP_BP512R1:
            return( LOAD_GROUP_A( brainpoolP512r1 ) );
#endif /* MBEDTLS_ECP_DP_BP512R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE25519_ENABLED)
        case MBEDTLS_ECP_DP_CURVE25519:
            grp->modp = ecp_mod_p255;
            return( ecp_use_curve25519( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE25519_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE448_ENABLED)
        case MBEDTLS_ECP_DP_CURVE448:
            grp->modp = ecp_mod_p448;
            return( ecp_use_curve448( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE448_ENABLED */

        default:
            mbedtls_ecp_group_free( grp );
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );
    }
}